

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O1

void __thiscall
duckdb::AsOfLocalSinkState::AsOfLocalSinkState
          (AsOfLocalSinkState *this,ClientContext *context,PartitionGlobalSinkState *gstate_p)

{
  vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_> *pvVar1;
  
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.batch_index.index + 4) =
       0xffffffff;
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.min_batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.min_batch_index.index + 4) =
       0xffffffff;
  pvVar1 = &(this->super_LocalSinkState).partition_info.partition_data.
            super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>;
  (pvVar1->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_LocalSinkState).partition_info.partition_data.
           super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
           super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__AsOfLocalSinkState_0249e4c8;
  PartitionLocalSinkState::PartitionLocalSinkState(&this->local_partition,context,gstate_p);
  return;
}

Assistant:

explicit AsOfLocalSinkState(ClientContext &context, PartitionGlobalSinkState &gstate_p)
	    : local_partition(context, gstate_p) {
	}